

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O2

void __thiscall jaegertracing::Span::setSamplingPriority(Span *this,Value *value)

{
  byte bVar1;
  bool bVar2;
  byte flags;
  SpanContext local_d0;
  
  bVar2 = opentracing::v3::util::
          variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
          ::
          visit<jaegertracing::(anonymous_namespace)::SamplingPriorityVisitor&,opentracing::v3::Value,bool>
                    (value,(SamplingPriorityVisitor *)value);
  std::mutex::lock(&this->_mutex);
  bVar1 = (this->_context)._flags;
  flags = bVar1 & 0xfe;
  if (bVar2) {
    flags = bVar1 | 3;
  }
  SpanContext::SpanContext
            (&local_d0,&(this->_context)._traceID,(this->_context)._spanID,
             (this->_context)._parentID,flags,&(this->_context)._baggage,&(this->_context)._debugID)
  ;
  SpanContext::swap(&this->_context,&local_d0);
  SpanContext::~SpanContext(&local_d0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void Span::setSamplingPriority(const opentracing::Value& value)
{
    SamplingPriorityVisitor visitor;
    const auto priority = opentracing::Value::visit(value, visitor);

    std::lock_guard<std::mutex> lock(_mutex);
    auto newFlags = _context.flags();
    if (priority) {
        newFlags |= static_cast<unsigned char>(SpanContext::Flag::kSampled) |
                    static_cast<unsigned char>(SpanContext::Flag::kDebug);
    }
    else {
        newFlags &= ~static_cast<unsigned char>(SpanContext::Flag::kSampled);
    }

    _context = SpanContext(_context.traceID(),
                           _context.spanID(),
                           _context.parentID(),
                           newFlags,
                           _context.baggage(),
                           _context.debugID());
}